

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

Comment * soul::SourceCodeUtilities::findPrecedingComment
                    (Comment *__return_storage_ptr__,CodeLocation *location)

{
  CodeLocation local_30;
  CodeLocation local_20;
  
  CodeLocation::getStartOfLine(&local_20);
  findStartOfPrecedingComment((SourceCodeUtilities *)&local_30,&local_20);
  parseComment(__return_storage_ptr__,&local_30);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_30.sourceCode);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_20.sourceCode);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::findPrecedingComment (CodeLocation location)
{
    return parseComment (findStartOfPrecedingComment (location.getStartOfLine()));
}